

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvs.c
# Opt level: O0

void simulate_unbind(FX2 *frame,int unbind_count,FX2 *returner)

{
  uint *puVar1;
  uint *puVar2;
  long lStack_40;
  int bindnvalues;
  LispPTR *lastpvar;
  uint *puStack_30;
  int value;
  LispPTR *stackptr;
  int unbind;
  FX2 *returner_local;
  int unbind_count_local;
  FX2 *frame_local;
  
  puStack_30 = (uint *)(Stackspace + (int)(uint)frame->nextblock);
  for (stackptr._4_4_ = 0; stackptr._4_4_ < unbind_count; stackptr._4_4_ = stackptr._4_4_ + 1) {
    do {
      puVar2 = puStack_30 + -1;
      puVar1 = puStack_30 + -1;
      puStack_30 = puVar2;
    } while (-1 < (int)*puVar1);
    lastpvar._4_4_ = (int)(*puVar2 ^ 0xffffffff) >> 0x10;
    lStack_40 = (long)&frame[1].fnheader + (long)(int)(*puVar2 & 0xffff) * 2;
    while (lastpvar._4_4_ = lastpvar._4_4_ + -1, -1 < lastpvar._4_4_) {
      *(undefined4 *)(lStack_40 + -4) = 0xffffffff;
      lStack_40 = lStack_40 + -4;
    }
  }
  if (returner != (FX2 *)0x0) {
    *(ushort *)&returner->field_0x2 = *(ushort *)&returner->field_0x2 & 0xefff;
  }
  return;
}

Assistant:

void simulate_unbind(FX2 *frame, int unbind_count, FX2 *returner) {
  int unbind;
  LispPTR *stackptr = (LispPTR *)(Stackspace + frame->nextblock);
  for (unbind = 0; unbind < unbind_count; unbind++) {
    int value;
    LispPTR *lastpvar;
    int bindnvalues;
    for (; ((int)*--stackptr >= 0);)
      ; /* find the binding mark */
    value = (int)*stackptr;
    lastpvar = (LispPTR *)((DLword *)frame + FRAMESIZE + 2 + GetLoWord(value));
    bindnvalues = (~value) >> 16;
    for (value = bindnvalues; --value >= 0;) { *--lastpvar = 0xffffffff; }
    /* This line caused \NSMAIL.READ.HEADING to smash memory, */
    /* so I removed it 21 Jul 91 --JDS.  This was the only	  */
    /* difference between this function and the UNWIND code   */
    /* in inlineC.h						  */
    /*	MAKEFREEBLOCK(stackptr, (DLword *)stackptr-nextblock); */
  }
  if (returner)
    returner->fast = 0; /* since we've destroyed contiguity */
                        /* in the stack, but that only
                           matters if there's a return. */
}